

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  iterator __position;
  cmExpandedCommandArgument *argument;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Self __tmp;
  int iVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  _List_node_base *p_Var11;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_c8;
  string *local_b0;
  MessageType *local_a8;
  cmExpandedCommandArgument *local_a0;
  string local_98;
  string local_78;
  cmExpandedCommandArgument local_58;
  
  p_Var2 = (newArgs->
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_b0 = errorString;
  local_a8 = status;
  do {
    if (p_Var2 == (_List_node_base *)newArgs) {
      return true;
    }
    argument = (cmExpandedCommandArgument *)((long)p_Var2 + 0x10);
    bVar5 = IsKeyword(this,&keyParenL_abi_cxx11_,argument);
    if (bVar5) {
      p_Var11 = p_Var2->_M_next;
      local_a0 = argument;
      if (p_Var11 == (_List_node_base *)newArgs) {
LAB_0033c2e1:
        std::__cxx11::string::_M_replace
                  ((ulong)local_b0,0,(char *)local_b0->_M_string_length,0x4a5326);
        *local_a8 = FATAL_ERROR;
        return false;
      }
      iVar8 = 1;
      do {
        bVar5 = IsKeyword(this,&keyParenL_abi_cxx11_,(cmExpandedCommandArgument *)(p_Var11 + 1));
        bVar6 = IsKeyword(this,&keyParenR_abi_cxx11_,(cmExpandedCommandArgument *)(p_Var11 + 1));
        iVar8 = (iVar8 + (uint)bVar5) - (uint)bVar6;
        p_Var11 = p_Var11->_M_next;
        if (p_Var11 == (_List_node_base *)newArgs) break;
      } while (iVar8 != 0);
      if (iVar8 != 0) goto LAB_0033c2e1;
      local_c8.
      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      _M_range_insert<std::_List_iterator<cmExpandedCommandArgument>>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 &local_c8,0,p_Var2->_M_next,p_Var11);
      pcVar1 = local_c8.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      pcVar3 = local_c8.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].Value._M_dataplus._M_p;
      paVar7 = &local_c8.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].Value.field_2;
      local_c8.
      super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
      _M_impl.super__Vector_impl_data._M_finish = pcVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar7) {
        operator_delete(pcVar3,paVar7->_M_allocated_capacity + 1);
      }
      bVar5 = IsTrue(this,&local_c8,local_b0,local_a8);
      if (bVar5) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"1","");
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&local_78,true);
        std::__cxx11::string::operator=((string *)local_a0,(string *)&local_58);
        *(bool *)&((_List_node_base *)((long)p_Var2 + 0x30))->_M_next = local_58.Quoted;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
          operator_delete(local_58.Value._M_dataplus._M_p,
                          local_58.Value.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_78.field_2._M_allocated_capacity;
        _Var10._M_p = local_78._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_0033c2a6:
          operator_delete(_Var10._M_p,uVar9 + 1);
        }
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"0","");
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_58,&local_98,true);
        std::__cxx11::string::operator=((string *)local_a0,(string *)&local_58);
        *(bool *)&((_List_node_base *)((long)p_Var2 + 0x30))->_M_next = local_58.Quoted;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.Value._M_dataplus._M_p != &local_58.Value.field_2) {
          operator_delete(local_58.Value._M_dataplus._M_p,
                          local_58.Value.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_98.field_2._M_allocated_capacity;
        _Var10._M_p = local_98._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_0033c2a6;
      }
      __position._M_node = p_Var2->_M_next;
      while (__position._M_node != p_Var11) {
        p_Var4 = (__position._M_node)->_M_next;
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        _M_erase(newArgs,__position);
        __position._M_node = p_Var4;
      }
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                (&local_c8);
    }
    p_Var2 = p_Var2->_M_next;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end()) {
      if (IsKeyword(keyParenL, *arg)) {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth) {
          if (this->IsKeyword(keyParenL, *argClose)) {
            depth++;
          }
          if (this->IsKeyword(keyParenR, *argClose)) {
            depth--;
          }
          argClose++;
        }
        if (depth) {
          errorString = "mismatched parenthesis in condition";
          status = MessageType::FATAL_ERROR;
          return false;
        }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value = this->IsTrue(newArgs2, errorString, status);
        if (value) {
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1, argClose);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}